

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  byte bVar1;
  xpath_variable_set *this_00;
  char_t *pcVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  lexeme_t lVar6;
  nodetest_t nVar7;
  xpath_lexer_string *pxVar8;
  char_t *pcVar9;
  xpath_variable *pxVar10;
  byte *pbVar11;
  xpath_parser *this_01;
  xpath_ast_node *pxVar12;
  ulong uVar13;
  xpath_ast_node *pxVar14;
  ulong uVar15;
  xpath_parse_result *pxVar16;
  char *pcVar17;
  xpath_value_type xVar18;
  anon_union_8_5_7bd254c6_for__data *paVar19;
  ast_type_t type;
  xpath_lexer_string *in_RSI;
  xpath_ast_node *in_R8;
  char_t *in_R9;
  xpath_lexer *this_02;
  anon_union_8_5_7bd254c6_for__data *paVar20;
  xpath_ast_node *args [2];
  xpath_lexer_string local_48;
  xpath_lexer *local_38;
  
  paVar19 = (anon_union_8_5_7bd254c6_for__data *)args;
  lVar6 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar6 - lex_minus) {
switchD_002ba7e8_caseD_9:
    pxVar12 = parse_location_path(this);
    return pxVar12;
  }
  this_02 = &this->_lexer;
  switch(lVar6) {
  case lex_minus:
    xpath_lexer::next(this_02);
    pxVar12 = parse_expression(this,7);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12 = alloc_node(this,ast_op_negate,xpath_type_number,pxVar12,(xpath_ast_node *)0x0);
    return pxVar12;
  default:
    goto switchD_002ba7e8_caseD_9;
  case lex_var_ref:
    goto switchD_002ba7e8_caseD_b;
  case lex_open_brace:
    goto switchD_002ba7e8_caseD_c;
  case lex_quoted_string:
  case lex_number:
    break;
  case lex_string:
    pbVar11 = (byte *)this_02->_cur;
    do {
      bVar1 = *pbVar11;
      pbVar11 = pbVar11 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
    if (bVar1 != 0x28) goto switchD_002ba7e8_caseD_9;
    this_01 = (xpath_parser *)xpath_lexer::contents(this_02);
    nVar7 = parse_node_test_type(this_01,in_RSI);
    if (nVar7 != nodetest_none) goto switchD_002ba7e8_caseD_9;
    lVar6 = (this->_lexer)._cur_lexeme;
  }
  switch(lVar6) {
  case lex_var_ref:
switchD_002ba7e8_caseD_b:
    pxVar8 = xpath_lexer::contents(this_02);
    this_00 = this->_variables;
    if (this_00 == (xpath_variable_set *)0x0) {
      pxVar16 = this->_result;
      pcVar17 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar2 = pxVar8->begin;
      uVar13 = (long)pxVar8->end - (long)pcVar2;
      pcVar9 = this->_scratch;
      local_38 = this_02;
      if ((0x1f < uVar13) &&
         (pcVar9 = (char_t *)
                   (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(uVar13 + 1), pcVar9 == (char_t *)0x0)) goto LAB_002babed;
      memcpy(pcVar9,pcVar2,uVar13);
      pcVar9[uVar13] = '\0';
      pxVar10 = xpath_variable_set::_find(this_00,pcVar9);
      if (pcVar9 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar9);
      }
      this_02 = local_38;
      if (pxVar10 != (xpath_variable *)0x0) {
        xpath_lexer::next(local_38);
        xVar18 = pxVar10->_type;
        pxVar12 = (xpath_ast_node *)alloc_node(this);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar12->_type = '\x14';
        pxVar12->_rettype = (char)xVar18;
        pxVar12->_axis = '\0';
        pxVar12->_test = '\0';
        goto LAB_002ba9ed;
      }
      pxVar16 = this->_result;
      pcVar17 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_002ba7e8_caseD_c:
    xpath_lexer::next(this_02);
    pxVar12 = parse_expression(this,0);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_02);
      goto LAB_002baaa8;
    }
    pxVar16 = this->_result;
    pcVar17 = "Expected \')\' to match an opening \'(\'";
    break;
  default:
    pxVar16 = this->_result;
    pcVar17 = "Unrecognizable primary expression";
    break;
  case lex_quoted_string:
    pxVar8 = xpath_lexer::contents(this_02);
    pxVar10 = (xpath_variable *)alloc_string(this,pxVar8);
    if (pxVar10 == (xpath_variable *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    xpath_lexer::next(this_02);
    pxVar12 = (xpath_ast_node *)alloc_node(this);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12->_type = '\x12';
    pxVar12->_rettype = '\x03';
    pxVar12->_axis = '\0';
    pxVar12->_test = '\0';
LAB_002ba9ed:
    pxVar12->_left = (xpath_ast_node *)0x0;
    pxVar12->_right = (xpath_ast_node *)0x0;
    pxVar12->_next = (xpath_ast_node *)0x0;
    (pxVar12->_data).variable = pxVar10;
    goto LAB_002baaa8;
  case lex_number:
    pxVar8 = xpath_lexer::contents(this_02);
    pcVar2 = pxVar8->begin;
    pxVar8 = xpath_lexer::contents(this_02);
    uVar13 = (long)pxVar8->end - (long)pcVar2;
    pcVar9 = this->_scratch;
    if ((0x1f < uVar13) &&
       (pcVar9 = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(uVar13 + 1), pcVar9 == (char_t *)0x0)) {
LAB_002babed:
      error_oom(this);
      return (xpath_ast_node *)0x0;
    }
    memcpy(pcVar9,pcVar2,uVar13);
    pcVar9[uVar13] = '\0';
    local_38 = (xpath_lexer *)convert_string_to_number(pcVar9);
    if (pcVar9 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar9);
    }
    xpath_lexer::next(this_02);
    pxVar12 = (xpath_ast_node *)alloc_node(this);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12->_type = '\x13';
    pxVar12->_rettype = '\x02';
    pxVar12->_axis = '\0';
    pxVar12->_test = '\0';
    pxVar12->_left = (xpath_ast_node *)0x0;
    pxVar12->_right = (xpath_ast_node *)0x0;
    pxVar12->_next = (xpath_ast_node *)0x0;
    (pxVar12->_data).number = (double)local_38;
LAB_002baaa8:
    local_38 = (xpath_lexer *)this->_depth;
    while (lVar6 = (this->_lexer)._cur_lexeme, lVar6 == lex_open_square_brace) {
      xpath_lexer::next(this_02);
      uVar13 = this->_depth + 1;
      this->_depth = uVar13;
      if (0x400 < uVar13) {
        pxVar16 = this->_result;
        pcVar17 = "Exceeded maximum allowed query depth";
        goto LAB_002bac9c;
      }
      if (pxVar12->_rettype != '\x01') {
        pxVar16 = this->_result;
        pcVar17 = "Predicate has to be applied to node set";
        goto LAB_002bac9c;
      }
      pxVar14 = parse_expression(this,0);
      if (pxVar14 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12 = alloc_node(this,ast_filter,pxVar12,pxVar14,(predicate_t)in_R8);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar16 = this->_result;
        pcVar17 = "Expected \']\' to match an opening \'[\'";
        goto LAB_002bac9c;
      }
      xpath_lexer::next(this_02);
    }
    this->_depth = (size_t)local_38;
    if ((lVar6 & ~lex_equal) != lex_slash) {
      return pxVar12;
    }
    xpath_lexer::next(this_02);
    if (lVar6 != lex_double_slash) {
LAB_002bac4a:
      pxVar12 = parse_relative_location_path(this,pxVar12);
      return pxVar12;
    }
    if (pxVar12->_rettype == '\x01') {
      pxVar12 = alloc_node(this,(ast_type_t)pxVar12,(xpath_ast_node *)0x5,axis_attribute,
                           nodetest_none,in_R9);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      goto LAB_002bac4a;
    }
    pxVar16 = this->_result;
    pcVar17 = "Step has to be applied to node set";
    break;
  case lex_string:
    args[0] = (xpath_ast_node *)0x0;
    args[1] = (xpath_ast_node *)0x0;
    pxVar8 = xpath_lexer::contents(this_02);
    local_48.begin = pxVar8->begin;
    local_48.end = pxVar8->end;
    xpath_lexer::next(this_02);
    if ((this->_lexer)._cur_lexeme == lex_open_brace) {
      xpath_lexer::next(this_02);
      sVar3 = this->_depth;
      uVar13 = 0;
      pxVar12 = (xpath_ast_node *)0x0;
      while (lVar6 = (this->_lexer)._cur_lexeme, lVar6 != lex_close_brace) {
        if (uVar13 != 0) {
          if (lVar6 != lex_comma) {
            pcVar17 = "No comma between function arguments";
            goto switchD_002bacf6_caseD_64;
          }
          xpath_lexer::next(this_02);
        }
        uVar15 = this->_depth + 1;
        this->_depth = uVar15;
        if (0x400 < uVar15) {
          pcVar17 = "Exceeded maximum allowed query depth";
          goto switchD_002bacf6_caseD_64;
        }
        pxVar14 = parse_expression(this,0);
        if (pxVar14 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        paVar20 = (anon_union_8_5_7bd254c6_for__data *)&pxVar12->_next;
        if (uVar13 < 2) {
          paVar20 = paVar19;
        }
        paVar20->variable = (xpath_variable *)pxVar14;
        uVar13 = uVar13 + 1;
        paVar19 = paVar19 + 1;
        pxVar12 = pxVar14;
      }
      xpath_lexer::next(this_02);
      this->_depth = sVar3;
      pcVar17 = "Unrecognized function or wrong parameter count";
      switch(*local_48.begin) {
      case 'b':
        bVar5 = xpath_lexer_string::operator==(&local_48,"boolean");
        if ((uVar13 == 1) && (bVar5)) {
          type = ast_func_boolean;
LAB_002bb154:
          xVar18 = xpath_type_boolean;
          pxVar12 = args[0];
          goto LAB_002bb15b;
        }
        break;
      case 'c':
        bVar5 = xpath_lexer_string::operator==(&local_48,"count");
        if ((uVar13 == 1) && (bVar5)) {
          if (args[0]->_rettype != '\x01') goto LAB_002bb292;
          type = ast_func_count;
LAB_002bb03f:
          xVar18 = xpath_type_number;
          pxVar12 = args[0];
          goto LAB_002bb15b;
        }
        bVar5 = xpath_lexer_string::operator==(&local_48,"contains");
        if ((uVar13 == 2) && (bVar5)) {
          type = ast_func_contains;
LAB_002bb127:
          xVar18 = xpath_type_boolean;
          pxVar12 = args[0];
          in_R8 = args[1];
          goto LAB_002bb15e;
        }
        bVar5 = xpath_lexer_string::operator==(&local_48,"concat");
        if ((1 < uVar13) && (bVar5)) {
          type = ast_func_concat;
          goto LAB_002bb21f;
        }
        bVar5 = xpath_lexer_string::operator==(&local_48,"ceiling");
        if ((uVar13 == 1) && (bVar5)) {
          type = ast_func_ceiling;
          goto LAB_002bb03f;
        }
        break;
      case 'f':
        bVar5 = xpath_lexer_string::operator==(&local_48,"false");
        if ((uVar13 == 0) && (bVar5)) {
          type = ast_func_false;
LAB_002bb000:
          xVar18 = xpath_type_boolean;
LAB_002bb003:
          pxVar12 = (xpath_ast_node *)0x0;
          goto LAB_002bb15b;
        }
        bVar5 = xpath_lexer_string::operator==(&local_48,"floor");
        if ((uVar13 == 1) && (bVar5)) {
          type = ast_func_floor;
          goto LAB_002bb03f;
        }
        break;
      case 'i':
        bVar5 = xpath_lexer_string::operator==(&local_48,"id");
        if ((uVar13 == 1) && (bVar5)) {
          type = ast_func_id;
          xVar18 = xpath_type_node_set;
          pxVar12 = args[0];
          goto LAB_002bb15b;
        }
        break;
      case 'l':
        bVar5 = xpath_lexer_string::operator==(&local_48,"last");
        if ((uVar13 == 0) && (bVar5)) {
          type = ast_func_last;
LAB_002bae99:
          xVar18 = xpath_type_number;
          goto LAB_002bb003;
        }
        bVar5 = xpath_lexer_string::operator==(&local_48,"lang");
        if ((uVar13 == 1) && (bVar5)) {
          type = ast_func_lang;
          goto LAB_002bb154;
        }
        bVar5 = xpath_lexer_string::operator==(&local_48,"local-name");
        if ((uVar13 < 2) && (bVar5)) {
          if ((uVar13 != 1) || (args[0]->_rettype == '\x01')) {
            iVar4 = 0x1a;
            goto LAB_002bb0f1;
          }
          goto LAB_002bb292;
        }
        break;
      case 'n':
        bVar5 = xpath_lexer_string::operator==(&local_48,"name");
        if ((uVar13 < 2) && (bVar5)) {
          if ((uVar13 != 1) || (args[0]->_rettype == '\x01')) {
            iVar4 = 0x1e;
LAB_002bb0f1:
            type = iVar4 - (uint)(uVar13 == 0);
            goto LAB_002bb0f5;
          }
        }
        else {
          bVar5 = xpath_lexer_string::operator==(&local_48,"namespace-uri");
          if ((1 < uVar13) || (!bVar5)) {
            bVar5 = xpath_lexer_string::operator==(&local_48,"normalize-space");
            if ((uVar13 < 2) && (bVar5)) {
              type = ast_func_normalize_space_1 - (uVar13 == 0);
              goto LAB_002bb21f;
            }
            bVar5 = xpath_lexer_string::operator==(&local_48,"not");
            if ((uVar13 == 1) && (bVar5)) {
              type = ast_func_not;
              goto LAB_002bb154;
            }
            bVar5 = xpath_lexer_string::operator==(&local_48,"number");
            if ((uVar13 < 2) && (bVar5)) {
              iVar4 = 0x33;
              goto LAB_002bb037;
            }
            break;
          }
          if ((uVar13 != 1) || (args[0]->_rettype == '\x01')) {
            iVar4 = 0x1c;
            goto LAB_002bb0f1;
          }
        }
LAB_002bb292:
        pcVar17 = "Function has to be applied to node set";
        break;
      case 'p':
        bVar5 = xpath_lexer_string::operator==(&local_48,"position");
        if ((uVar13 == 0) && (bVar5)) {
          type = ast_func_position;
          goto LAB_002bae99;
        }
        break;
      case 'r':
        bVar5 = xpath_lexer_string::operator==(&local_48,"round");
        if ((uVar13 == 1) && (bVar5)) {
          type = ast_func_round;
          goto LAB_002bb03f;
        }
        break;
      case 's':
        bVar5 = xpath_lexer_string::operator==(&local_48,"string");
        if ((1 < uVar13) || (!bVar5)) {
          bVar5 = xpath_lexer_string::operator==(&local_48,"string-length");
          if ((1 < uVar13) || (!bVar5)) {
            bVar5 = xpath_lexer_string::operator==(&local_48,"starts-with");
            if ((uVar13 == 2) && (bVar5)) {
              type = ast_func_starts_with;
              goto LAB_002bb127;
            }
            bVar5 = xpath_lexer_string::operator==(&local_48,"substring-before");
            if ((uVar13 == 2) && (bVar5)) {
              type = ast_func_substring_before;
            }
            else {
              bVar5 = xpath_lexer_string::operator==(&local_48,"substring-after");
              if ((uVar13 == 2) && (bVar5)) {
                type = ast_func_substring_after;
              }
              else {
                bVar5 = xpath_lexer_string::operator==(&local_48,"substring");
                if (((uVar13 & 0xfffffffffffffffe) != 2) || (!bVar5)) {
                  bVar5 = xpath_lexer_string::operator==(&local_48,"sum");
                  if ((uVar13 == 1) && (bVar5)) {
                    if (args[0]->_rettype != '\x01') goto LAB_002bb292;
                    type = ast_func_sum;
                    goto LAB_002bb03f;
                  }
                  break;
                }
                type = uVar13 == 2 ^ ast_func_substring_3;
              }
            }
            goto LAB_002bb21f;
          }
          iVar4 = 0x29;
LAB_002bb037:
          type = iVar4 - (uint)(uVar13 == 0);
          goto LAB_002bb03f;
        }
        type = ast_func_string_1 - (uVar13 == 0);
LAB_002bb0f5:
        xVar18 = xpath_type_string;
        pxVar12 = args[0];
LAB_002bb15b:
        in_R8 = (xpath_ast_node *)0x0;
LAB_002bb15e:
        pxVar12 = alloc_node(this,type,xVar18,pxVar12,in_R8);
        if (pxVar12 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        goto LAB_002baaa8;
      case 't':
        bVar5 = xpath_lexer_string::operator==(&local_48,"translate");
        if ((uVar13 == 3) && (bVar5)) {
          type = ast_func_translate;
LAB_002bb21f:
          xVar18 = xpath_type_string;
          pxVar12 = args[0];
          in_R8 = args[1];
          goto LAB_002bb15e;
        }
        bVar5 = xpath_lexer_string::operator==(&local_48,"true");
        if ((uVar13 == 0) && (bVar5)) {
          type = ast_func_true;
          goto LAB_002bb000;
        }
      }
    }
    else {
      pcVar17 = "Unrecognized function call";
    }
switchD_002bacf6_caseD_64:
    pxVar16 = this->_result;
    pxVar16->error = pcVar17;
    goto LAB_002bac9f;
  }
LAB_002bac9c:
  pxVar16->error = pcVar17;
LAB_002bac9f:
  pxVar16->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI_IMPL_IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}